

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O3

void __thiscall LinearSystem::RunReverseGauss(LinearSystem *this)

{
  pointer pOVar1;
  uint uVar2;
  bool bVar3;
  Fraction *pFVar4;
  Fraction coefficient_00;
  uint row;
  int row_00;
  Fraction coefficient;
  Fraction local_38;
  
  uVar2 = this->n_;
  if (this->m_ < this->n_) {
    uVar2 = this->m_;
  }
  if (0 < (int)uVar2) {
    do {
      row = uVar2 - 1;
      pFVar4 = ExtendedMatrix::At(&this->system_,row,row);
      Fraction::Fraction(&local_38,0);
      bVar3 = operator==(pFVar4,&local_38);
      if (!bVar3) {
        if (1 < uVar2) {
          row_00 = uVar2 - 2;
          do {
            pFVar4 = ExtendedMatrix::At(&this->system_,row_00,row);
            local_38 = *pFVar4;
            coefficient_00 = Fraction::operator-(&local_38);
            PerformOperation(this,AddRow,row_00,row,coefficient_00);
            bVar3 = row_00 != 0;
            row_00 = row_00 + -1;
          } while (bVar3);
        }
        pOVar1 = (this->history_).
                 super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (((this->history_).
             super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
             _M_impl.super__Vector_impl_data._M_start != pOVar1) &&
           (pOVar1[-1].operation_type != MainOutput)) {
          std::vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>::
          emplace_back<>(&this->history_);
        }
      }
      bVar3 = 1 < (int)uVar2;
      uVar2 = row;
    } while (bVar3);
  }
  return;
}

Assistant:

bool LinearSystem::ApplyOperation(const Operation& operation) {
  return ApplyOperation(operation.operation_type, operation.lhs, operation.rhs,
      operation.coefficient);
}